

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void can_add_to_copies(_Bool copy_on_write)

{
  byte bVar1;
  roaring_bitmap_t *r;
  roaring_bitmap_t *prVar2;
  byte in_DIL;
  roaring_bitmap_t *bm2;
  roaring_bitmap_t *bm1;
  uint32_t in_stack_0000002c;
  roaring_bitmap_t *in_stack_00000030;
  int line;
  undefined7 in_stack_fffffffffffffff8;
  
  bVar1 = in_DIL & 1;
  r = roaring_bitmap_create();
  roaring_bitmap_set_copy_on_write(r,(_Bool)(bVar1 & 1));
  roaring_bitmap_add(in_stack_00000030,in_stack_0000002c);
  prVar2 = roaring_bitmap_copy(bm1);
  line = (int)((ulong)prVar2 >> 0x20);
  roaring_bitmap_get_cardinality(bm2);
  _assert_true((unsigned_long)bm2,(char *)CONCAT17(bVar1,in_stack_fffffffffffffff8),(char *)r,line);
  roaring_bitmap_get_cardinality(bm2);
  _assert_true((unsigned_long)bm2,(char *)CONCAT17(bVar1,in_stack_fffffffffffffff8),(char *)r,line);
  roaring_bitmap_add(in_stack_00000030,in_stack_0000002c);
  roaring_bitmap_add(in_stack_00000030,in_stack_0000002c);
  roaring_bitmap_get_cardinality(bm2);
  _assert_true((unsigned_long)bm2,(char *)CONCAT17(bVar1,in_stack_fffffffffffffff8),(char *)r,line);
  roaring_bitmap_get_cardinality(bm2);
  _assert_true((unsigned_long)bm2,(char *)CONCAT17(bVar1,in_stack_fffffffffffffff8),(char *)r,line);
  roaring_bitmap_free((roaring_bitmap_t *)0x103780);
  roaring_bitmap_free((roaring_bitmap_t *)0x103789);
  return;
}

Assistant:

void can_add_to_copies(bool copy_on_write) {
    roaring_bitmap_t *bm1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(bm1, copy_on_write);
    roaring_bitmap_add(bm1, 3);
    roaring_bitmap_t *bm2 = roaring_bitmap_copy(bm1);
    assert_true(roaring_bitmap_get_cardinality(bm1) == 1);
    assert_true(roaring_bitmap_get_cardinality(bm2) == 1);
    roaring_bitmap_add(bm2, 4);
    roaring_bitmap_add(bm1, 5);
    assert_true(roaring_bitmap_get_cardinality(bm1) == 2);
    assert_true(roaring_bitmap_get_cardinality(bm2) == 2);
    roaring_bitmap_free(bm1);
    roaring_bitmap_free(bm2);
}